

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

void envy_bios_print_info(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_bit_entry *peVar1;
  long lVar2;
  int *piVar3;
  
  peVar1 = (bios->info).bit;
  if ((mask & 0x10) == 0 || peVar1 == (envy_bios_bit_entry *)0x0) {
    return;
  }
  if ((bios->info).valid != '\0') {
    fprintf((FILE *)out,"INFO: BIOS version 0x%02x.%02x.%02x.%02x.%02x from %s for",
            (ulong)(bios->info).version[0],(ulong)(bios->info).version[1],
            (ulong)(bios->info).version[2],(ulong)(bios->info).version[3],
            (ulong)(bios->info).version[4],(bios->info).date);
    if (bios->chipset == 0) {
      fwrite(" unknown chipset",0x10,1,(FILE *)out);
    }
    else {
      fprintf((FILE *)out," NV%02X");
      if (bios->chipset_name != (char *)0x0) {
        fprintf((FILE *)out," [%s]");
      }
    }
    fputc(10,(FILE *)out);
    if ((bios->info).real_pcidev != 0) {
      fprintf((FILE *)out,"INFO: BR02 card, real device id 0x%04x\n");
    }
    fwrite("INFO: features",0xe,1,(FILE *)out);
    piVar3 = &envy_bios_print_info_featurenames_rel;
    lVar2 = 0;
    do {
      if (((bios->info).feature >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        fprintf((FILE *)out," %s",(long)&envy_bios_print_info_featurenames_rel + (long)*piVar3);
      }
      lVar2 = lVar2 + 1;
      piVar3 = piVar3 + 1;
    } while (lVar2 != 0x10);
    if ((bios->info).feature == 0) {
      fwrite(" (none)",7,1,(FILE *)out);
    }
    fwrite(", unk07",7,1,(FILE *)out);
    lVar2 = 0xc0;
    do {
      fprintf((FILE *)out," 0x%02x",(ulong)*(byte *)((long)&bios->data + lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xc6);
    if (*(int *)((bios->info).unk19 + 4) != 0 || *(int *)(bios->info).unk19 != 0) {
      fwrite(", unk19",7,1,(FILE *)out);
      lVar2 = 0;
      do {
        fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk19[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
    }
    if ((bios->info).unk23 != '\0') {
      fprintf((FILE *)out,", unk23 0x%02x");
    }
    if ((bios->info).unk24 != '\0') {
      fprintf((FILE *)out,", unk24 0x%02x");
    }
    if ((bios->info).unk25 != '\0') {
      fprintf((FILE *)out,", unk25 0x%02x");
    }
    if ((bios->info).unk26 != 0) {
      fprintf((FILE *)out,", unk26 0x%04x");
    }
    if (*(int *)((bios->info).unk28 + 4) != 0 || *(int *)(bios->info).unk28 != 0) {
      fwrite(", unk28",7,1,(FILE *)out);
      lVar2 = 0;
      do {
        fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk28[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
    }
    if ((bios->info).unk30[0] != '\0') {
      fprintf((FILE *)out,", unk30 %s",(bios->info).unk30);
      if ((bios->info).unk30[3] == '\0') {
        fprintf((FILE *)out," %s",(bios->info).unk30 + 4);
      }
    }
    if (*(int *)((bios->info).unk3c + 4) != 0 || *(int *)(bios->info).unk3c != 0) {
      fwrite(", unk3c",7,1,(FILE *)out);
      lVar2 = 0;
      do {
        fprintf((FILE *)out," 0x%02x",(ulong)(bios->info).unk3c[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
    }
    fputc(10,(FILE *)out);
    peVar1 = (bios->info).bit;
    envy_bios_dump_hex(bios,out,(uint)peVar1->t_offset,(uint)peVar1->t_len,mask);
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse BIT table \'i\' at 0x%04x version 2\n\n",
          (ulong)peVar1->t_offset);
  return;
}

Assistant:

void envy_bios_print_info (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_info *info = &bios->info;
	if (!info->bit || !(mask & ENVY_BIOS_PRINT_INFO))
		return;
	if (!info->valid) {
		fprintf(out, "Failed to parse BIT table 'i' at 0x%04x version 2\n\n", info->bit->t_offset);
		return;
	}
	fprintf(out, "INFO: BIOS version 0x%02x.%02x.%02x.%02x.%02x from %s for", info->version[0], info->version[1], info->version[2], info->version[3], info->version[4], info->date);
	if (bios->chipset) {
		fprintf(out, " NV%02X", bios->chipset);
		if (bios->chipset_name)
			fprintf(out, " [%s]", bios->chipset_name);
	} else {
		fprintf(out, " unknown chipset");
	}
	fprintf(out, "\n");
	if (info->real_pcidev)
		fprintf(out, "INFO: BR02 card, real device id 0x%04x\n", info->real_pcidev);
	fprintf(out, "INFO: features");
	int i;
	static const char *const featurenames[16] = {
		"UNK0",
		"UNK1",
		"UNK2",
		"UNK3",
		"MOBILE",
		/* fun: these mean that FP or TV *tables* are present, not that FP or TV is present - always set on BIT BIOS. Given up on nv50+. */
		"FP",
		"TV",
		"UNK7",
		"UNK8",
		"UNK9",
		"UNK10",
		"UNK11",
		"UNK12",
		"UNK13",
		"UNK14",
		"UNK15",
	};
	for (i = 0; i < 16; i++)
		if (info->feature & 1 << i)
			fprintf(out, " %s", featurenames[i]);
	if (!info->feature)
		fprintf(out, " (none)");
	fprintf(out, ", unk07");
	for (i = 0; i < 6; i++)
		fprintf(out, " 0x%02x", info->unk07[i]);
	int unk19_st = 0;
	for (i = 0; i < 8; i++)
		if (info->unk19[i])
			unk19_st = 1;
	if (unk19_st) {
		fprintf(out, ", unk19");
		for (i = 0; i < 8; i++)
			fprintf(out, " 0x%02x", info->unk19[i]);
	}
	if (info->unk23)
		fprintf(out, ", unk23 0x%02x", info->unk23);
	if (info->unk24)
		fprintf(out, ", unk24 0x%02x", info->unk24);
	if (info->unk25)
		fprintf(out, ", unk25 0x%02x", info->unk25);
	if (info->unk26)
		fprintf(out, ", unk26 0x%04x", info->unk26);
	int unk28_st = 0;
	for (i = 0; i < 8; i++)
		if (info->unk28[i])
			unk28_st = 1;
	if (unk28_st) {
		fprintf(out, ", unk28");
		for (i = 0; i < 8; i++)
			fprintf(out, " 0x%02x", info->unk28[i]);
	}
	if (info->unk30[0]) {
		fprintf(out, ", unk30 %s", info->unk30);
		/* umm wtf? */
		if (!info->unk30[3])
			fprintf(out, " %s", info->unk30+4);
	}
	int unk3c_st = 0;
	for (i = 0; i < 8; i++)
		if (info->unk3c[i])
			unk3c_st = 1;
	if (unk3c_st) {
		fprintf(out, ", unk3c");
		for (i = 0; i < 8; i++)
			fprintf(out, " 0x%02x", info->unk3c[i]);
	}
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, info->bit->t_offset, info->bit->t_len, mask);
	fprintf(out, "\n");
}